

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

void __thiscall ktx::CommandCreate::executeCreate(CommandCreate *this)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  undefined4 uVar4;
  ktxTexture2 *report;
  ktxTexture2 *pkVar5;
  undefined8 uVar6;
  path *this_00;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  ktxTexture *this_01;
  string *in_RDI;
  Reporter *in_stack_00000060;
  OptionsMetrics *in_stack_00000068;
  KTXTexture2 *in_stack_00000070;
  MetricsCalculator *in_stack_00000078;
  OutputStream outputFile;
  path outputPath;
  string writerScParams;
  MetricsCalculator metrics;
  string writer;
  uint32_t maxLevels;
  ImageSpec firstImageSpec;
  bool firstImage;
  ColorSpaceInfo colorSpaceInfo;
  ImageSpec target;
  KTXTexture2 texture;
  anon_class_8_1_8991fb9c warningFn;
  string *in_stack_fffffffffffffa78;
  path *in_stack_fffffffffffffa80;
  OptionsEncodeBasis<false> *in_stack_fffffffffffffa90;
  ktxHashList *ppkVar10;
  undefined4 in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  CommandCreate *in_stack_fffffffffffffaa0;
  format fVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  string_type *__source;
  OptionsDeflate *in_stack_fffffffffffffac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffad0;
  int in_stack_fffffffffffffad4;
  ktxTexture2 *in_stack_fffffffffffffad8;
  anon_class_64_8_b01583d2 *in_stack_fffffffffffffae0;
  FormatDescriptor *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  OptionsMetrics *opts;
  KTXTexture2 *texture_00;
  Reporter *in_stack_fffffffffffffb20;
  ktxTexture *in_stack_fffffffffffffb28;
  OutputStream *in_stack_fffffffffffffb30;
  path local_4b8;
  string local_490 [32];
  string local_470 [72];
  char *local_428;
  undefined1 local_420 [72];
  string local_3d8 [32];
  char *local_3b8;
  KTXTexture2 local_3b0;
  string local_3a8 [40];
  undefined1 *local_380;
  undefined1 *local_378;
  KTXTexture2 *local_370;
  undefined1 *local_368;
  undefined4 *local_360;
  undefined1 *local_358;
  undefined4 *local_350;
  undefined4 local_344;
  undefined1 local_340 [40];
  format_args in_stack_fffffffffffffce8;
  string_view in_stack_fffffffffffffcf8;
  undefined1 local_2b9;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined1 local_280 [128];
  KTXTexture2 local_200;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [40];
  undefined8 local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  string *local_1a0;
  OptionsMetrics *local_198;
  char *local_190;
  ktxTexture2 *pkStack_188;
  string *local_180;
  char *local_178;
  char **local_170;
  undefined1 local_168 [64];
  undefined8 local_128;
  undefined1 *local_120;
  char *local_118;
  size_type *local_108;
  undefined1 *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 auStack_e0 [24];
  char **local_c8;
  char *local_c0;
  char **local_b8;
  char *local_b0;
  char **local_a8;
  undefined1 *local_a0;
  undefined8 *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined8 *local_80;
  undefined1 *local_78;
  char **local_70;
  char *local_68;
  char *local_58;
  char **local_50;
  char *local_48;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  char *local_8;
  
  KTXTexture2::KTXTexture2(&local_200,(nullptr_t)0x0);
  uVar2 = FormatDescriptor::channelCount((FormatDescriptor *)&in_RDI[2].field_2);
  *(uint32_t *)((long)&in_RDI[0x1e].field_2 + 8) = uVar2;
  ImageSpec::ImageSpec((ImageSpec *)in_stack_fffffffffffffa90);
  local_2b8 = 0;
  local_2b4 = 0;
  std::unique_ptr<TransferFunction_const,std::default_delete<TransferFunction_const>>::
  unique_ptr<std::default_delete<TransferFunction_const>,void>
            ((unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_> *)
             in_stack_fffffffffffffa80);
  std::unique_ptr<ColorPrimaries_const,std::default_delete<ColorPrimaries_const>>::
  unique_ptr<std::default_delete<ColorPrimaries_const>,void>
            ((unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)
             in_stack_fffffffffffffa80);
  std::unique_ptr<TransferFunction_const,std::default_delete<TransferFunction_const>>::
  unique_ptr<std::default_delete<TransferFunction_const>,void>
            ((unique_ptr<const_TransferFunction,_std::default_delete<const_TransferFunction>_> *)
             in_stack_fffffffffffffa80);
  std::unique_ptr<ColorPrimaries_const,std::default_delete<ColorPrimaries_const>>::
  unique_ptr<std::default_delete<ColorPrimaries_const>,void>
            ((unique_ptr<const_ColorPrimaries,_std::default_delete<const_ColorPrimaries>_> *)
             in_stack_fffffffffffffa80);
  local_2b9 = 1;
  ImageSpec::ImageSpec((ImageSpec *)in_stack_fffffffffffffa90);
  local_344 = 1;
  local_380 = &local_2b9;
  local_378 = local_280;
  local_370 = &local_200;
  local_368 = local_1f8;
  local_360 = &local_344;
  local_358 = local_340;
  local_350 = &local_2b8;
  foreachImage<ktx::CommandCreate::executeCreate()::__0>
            ((CommandCreate *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
             in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
  local_170 = &local_3b8;
  local_178 = "{} {}";
  local_b0 = "{} {}";
  local_3b8 = "{} {}";
  texture_00 = &local_3b0;
  local_a8 = local_170;
  report = (ktxTexture2 *)std::char_traits<char>::length((char_type *)0x1db025);
  texture_00->handle_ = report;
  local_58 = local_178;
  opts = (OptionsMetrics *)&in_RDI->_M_string_length;
  version_abi_cxx11_(SUB81((ulong)in_stack_fffffffffffffaa8 >> 0x38,0));
  local_180 = local_3a8;
  local_190 = local_3b8;
  pkStack_188 = local_3b0.handle_;
  local_1a0 = local_3d8;
  local_70 = &local_190;
  local_1b0 = local_3b8;
  local_198 = opts;
  local_68 = local_1b0;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffffaa8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffaa0);
  local_98 = &local_1c0;
  local_a0 = local_1e8;
  local_88 = 0xdd;
  local_1c0 = 0xdd;
  local_90 = local_a0;
  local_80 = local_98;
  local_78 = local_a0;
  local_1b8 = local_a0;
  ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffcf8,in_stack_fffffffffffffce8);
  std::__cxx11::string::~string(local_3d8);
  pkVar5 = KTXTexture2::operator->(&local_200);
  ppkVar10 = &pkVar5->kvDataHead;
  iVar3 = std::__cxx11::string::size();
  iVar3 = iVar3 + 1;
  uVar6 = std::__cxx11::string::c_str();
  ktxHashList_AddKVPair(ppkVar10,"KTXwriter",iVar3,uVar6);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x1db269);
  if (bVar1) {
    in_stack_fffffffffffffad8 = KTXTexture2::operator->(&local_200);
    in_stack_fffffffffffffac8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &in_stack_fffffffffffffad8->kvDataHead;
    in_stack_fffffffffffffac0 = (OptionsDeflate *)&in_RDI[10].field_2;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1db2ad);
    in_stack_fffffffffffffad4 = std::__cxx11::string::size();
    in_stack_fffffffffffffad4 = in_stack_fffffffffffffad4 + 1;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1db2c5);
    uVar6 = std::__cxx11::string::c_str();
    ktxHashList_AddKVPair(in_stack_fffffffffffffac8,"KTXswizzle",in_stack_fffffffffffffad4,uVar6);
  }
  MetricsCalculator::MetricsCalculator((MetricsCalculator *)0x1db388);
  MetricsCalculator::saveReferenceImages
            ((MetricsCalculator *)report,texture_00,opts,(Reporter *)pkVar5);
  if (*(int *)&in_RDI[0x19].field_2 != 0) {
    encodeBasis(in_stack_fffffffffffffaa0,
                (KTXTexture2 *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
                in_stack_fffffffffffffa90);
  }
  if ((in_RDI[0x10].field_2._M_local_buf[8] & 1U) != 0) {
    encodeASTC(in_stack_fffffffffffffaa0,
               (KTXTexture2 *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98),
               (OptionsEncodeASTC *)in_stack_fffffffffffffa90);
  }
  fVar11 = (format)((ulong)in_stack_fffffffffffffaa0 >> 0x38);
  MetricsCalculator::decodeAndCalculateMetrics
            (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060);
  compress((CommandCreate *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
           (KTXTexture2 *)in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  local_c8 = &local_428;
  auStack_e0._16_8_ = "{}{}{}{}";
  local_c0 = "{}{}{}{}";
  local_428 = "{}{}{}{}";
  __source = (string_type *)local_420;
  local_b8 = local_c8;
  this_00 = (path *)std::char_traits<char>::length((char_type *)0x1db4e9);
  *(path **)__source = this_00;
  local_8 = (char *)auStack_e0._16_8_;
  local_f0 = (undefined1 *)((long)&in_RDI[0xf].field_2 + 8);
  local_f8 = &in_RDI[0x17].field_2;
  local_100 = (undefined1 *)((long)&in_RDI[0x19].field_2 + 8);
  local_108 = &in_RDI[0x1b]._M_string_length;
  auStack_e0._8_8_ = local_420 + 8;
  local_e8 = local_428;
  auStack_e0._0_8_ = local_420._0_8_;
  local_50 = &local_e8;
  local_118 = local_428;
  local_48 = local_118;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffad8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),in_stack_fffffffffffffac8
             ,&in_stack_fffffffffffffac0->compressOptions);
  local_30 = &local_128;
  local_38 = local_168;
  local_20 = 0xdddd;
  local_128 = 0xdddd;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  local_120 = local_38;
  ::fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffcf8,in_stack_fffffffffffffce8);
  lVar7 = std::__cxx11::string::size();
  if (lVar7 != 0) {
    pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)(local_420 + 8));
    if (*pcVar8 != ' ') {
      __assert_fail("writerScParams[0] == \' \'",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                    ,0x73e,"void ktx::CommandCreate::executeCreate()");
    }
    pkVar5 = KTXTexture2::operator->(&local_200);
    ppkVar10 = &pkVar5->kvDataHead;
    uVar4 = std::__cxx11::string::size();
    fVar11 = (format)((ulong)pkVar5 >> 0x38);
    lVar7 = std::__cxx11::string::c_str();
    ktxHashList_AddKVPair(ppkVar10,"KTXwriterScParams",uVar4,lVar7 + 1);
  }
  std::__cxx11::string::string(local_490,(string *)in_RDI[0x1d].field_2._M_local_buf);
  DecodeUTF8Path(in_stack_fffffffffffffa78);
  std::filesystem::__cxx11::path::path(this_00,__source,fVar11);
  std::__cxx11::string::~string(local_470);
  std::__cxx11::string::~string(local_490);
  uVar9 = std::filesystem::__cxx11::path::has_parent_path();
  if ((uVar9 & 1) != 0) {
    std::filesystem::__cxx11::path::parent_path();
    std::filesystem::create_directories(&local_4b8);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffa80);
  }
  OutputStream::OutputStream((OutputStream *)in_stack_fffffffffffffb20,in_RDI,(Reporter *)report);
  this_01 = KTXTexture2::operator_cast_to_ktxTexture_(&local_200);
  OutputStream::writeKTX2
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  OutputStream::~OutputStream((OutputStream *)this_01);
  std::filesystem::__cxx11::path::~path((path *)this_01);
  std::__cxx11::string::~string((string *)(local_420 + 8));
  MetricsCalculator::~MetricsCalculator((MetricsCalculator *)0x1db940);
  std::__cxx11::string::~string(local_3a8);
  ImageSpec::~ImageSpec((ImageSpec *)0x1db95a);
  ColorSpaceInfo::~ColorSpaceInfo((ColorSpaceInfo *)this_01);
  ImageSpec::~ImageSpec((ImageSpec *)0x1db974);
  KTXTexture2::~KTXTexture2((KTXTexture2 *)this_01);
  return;
}

Assistant:

void CommandCreate::executeCreate() {
    const auto warningFn = [this](const std::string& w) { this->warning(w); };

    KTXTexture2 texture{nullptr};
    targetChannelCount = options.formatDesc.channelCount();

    ImageSpec target;
    ColorSpaceInfo colorSpaceInfo{};

    bool firstImage = true;
    ImageSpec firstImageSpec{};
    uint32_t maxLevels = 1;

    foreachImage(options.formatDesc, [&](
            const auto& inputFilepath,
            uint32_t levelIndex,
            uint32_t layerIndex,
            uint32_t faceIndex,
            uint32_t depthSliceIndex) {

        if (options.raw) {
            if (std::exchange(firstImage, false)) {
                target = ImageSpec{
                        options.width.value_or(1u),
                        options.height.value_or(1u),
                        options.depth.value_or(1u),
                        options.formatDesc};

                if (options.cubemap && target.width() != target.height())
                    fatal(rc::INVALID_FILE, "--cubemap specified but the input image \"{}\" with size {}x{} is not square.",
                            fmtInFile(inputFilepath), target.width(), target.height());

                if (options.assignTF.has_value())
                    target.format().setTransfer(options.assignTF.value());

                if (options.assignPrimaries.has_value())
                    target.format().setPrimaries(options.assignPrimaries.value());

                if (options.assignTexcoordOrigin.has_value())
                    target.setOrigin(options.assignTexcoordOrigin.value());

                texture = createTexture(target);
            }

            const auto rawData = readRawFile(inputFilepath);

            const auto expectedFileSize = ktxTexture_GetImageSize(texture, levelIndex);
            if (rawData.size() != expectedFileSize)
                fatal(rc::INVALID_FILE, "Raw input file \"{}\" with {} bytes for level {} does not match the expected size of {} bytes.",
                        fmtInFile(inputFilepath), rawData.size(), levelIndex, expectedFileSize);

            const auto ret = ktxTexture_SetImageFromMemory(
                    texture,
                    levelIndex,
                    layerIndex,
                    faceIndex + depthSliceIndex, // Faces and Depths are mutually exclusive, Addition is acceptable
                    reinterpret_cast<const ktx_uint8_t*>(rawData.data()),
                    rawData.size());
            assert(ret == KTX_SUCCESS && "Internal error"); (void) ret;
        } else {
            const auto inputImageFile = ImageInput::open(inputFilepath, nullptr, warningFn);
            inputImageFile->seekSubimage(0, 0); // Loading multiple subimage from the same input is not supported

            ImageSpec::Origin usedSourceOrigin;

            if (std::exchange(firstImage, false)) {
                uint32_t targetWidth, targetHeight;
                if (options.imageScale.has_value()) {
                    targetWidth = static_cast<uint32_t>(inputImageFile->spec().width()
                                                        * options.imageScale.value());
                    targetHeight = static_cast<uint32_t>(inputImageFile->spec().height()
                                                         * options.imageScale.value());
                    // TODO: scale depth
                } else {
                    targetWidth = options.width.value_or(inputImageFile->spec().width());
                    targetHeight = options.height.value_or(inputImageFile->spec().height());
                    // TODO: handle resampling depth
                }

                target = ImageSpec{
                    targetWidth,
                    targetHeight,
                    options.depth.value_or(1u),
                    options.formatDesc};

               if (options.cubemap && target.width() != target.height())
                    fatal(rc::INVALID_FILE, "--cubemap specified but the input image \"{}\" with size {}x{} is not square.",
                            fmtInFile(inputFilepath), target.width(), target.height());

                if (options._1d && target.height() != 1)
                    fatal(rc::INVALID_FILE, "For --1d textures the input image height must be 1, but for \"{}\" it was {}.",
                            fmtInFile(inputFilepath), target.height());

                const auto maxDimension = std::max(target.width(), std::max(target.height(), baseDepth));
                maxLevels = log2(maxDimension) + 1;
                if (options.levels.value_or(1) > maxLevels) {
                    auto errorFmt = "Requested {} levels is too many. With {} {}x{} and depth {} the texture can only have {} levels at most.";
                    std::string baseExpl;
                    if (options.width.has_value() || options.height.has_value()) {
                        baseExpl = "a requested base image size of";
                    } else if (options.imageScale.has_value()) {
                        baseExpl = fmt::format(
                                           "base input image \"{}\" sized {}x{} * scale {} being",
                                           fmtInFile(inputFilepath), inputImageFile->spec().width(),
                                           inputImageFile->spec().height(),
                                           options.imageScale.value());
                    } else {
                        baseExpl = fmt::format("base input image \"{}\" sized", fmtInFile(inputFilepath));
                    }
                    fatal_usage(errorFmt, options.levels.value_or(1),
                                baseExpl,
                                target.width(), target.height(),
                                baseDepth, maxLevels);
                }

                checkNumInputImages();

                if (options.encodeASTC)
                    selectASTCMode(inputImageFile->spec().format().largestChannelBitLength());

                firstImageSpec = inputImageFile->spec();

                determineTargetColorSpace(*inputImageFile, target, colorSpaceInfo);
                determineTargetOrigin(*inputImageFile, target, usedSourceOrigin);
      
                texture = createTexture(target);
            } else {
                checkSpecsMatch(*inputImageFile, firstImageSpec);
                determineSourceColorSpace(*inputImageFile, colorSpaceInfo.src);
                determineSourceOrigin(*inputImageFile, usedSourceOrigin);
            }

            const uint32_t expectedImageWidth = std::max(firstImageSpec.width() >> levelIndex, 1u);
            const uint32_t expectedImageHeight = std::max(firstImageSpec.height() >> levelIndex, 1u);
            const uint32_t targetImageWidth = std::max(target.width() >> levelIndex, 1u);
            const uint32_t targetImageHeight = std::max(target.height() >> levelIndex, 1u);

            if (inputImageFile->spec().width() != expectedImageWidth || inputImageFile->spec().height() != expectedImageHeight) {
                const auto errorFmt = "Input image \"{}\" with size {}x{} does not match expected size {}x{} for level {}.";
                fatal(rc::INVALID_FILE, errorFmt, fmtInFile(inputFilepath),
                      inputImageFile->spec().width(),
                      inputImageFile->spec().height(),
                      // When no scaling option is specified image* == targetImage*.
                      expectedImageWidth, expectedImageHeight,
                      levelIndex);
            }
            auto image = loadInputImage(*inputImageFile);

            // Need to do color conversion if either the transfer functions or primaries don't
            // match. Primaries conversion requires decode to linear then reencode thus
            // transferFunctions are always required.
            if (target.format().transfer() != colorSpaceInfo.src.usedTransferFunction ||
                target.format().primaries() != colorSpaceInfo.src.usedPrimaries) {
                assert((target.format().primaries() == colorSpaceInfo.src.usedPrimaries
                       || colorSpaceInfo.src.usedPrimaries != KHR_DF_PRIMARIES_UNSPECIFIED)
                       && "determineSourceColorSpace failed to check for UNSPECIFIED.");
                const auto errorFmt = "Colorspace conversion requires unsupported {} {} {}.";
                if (colorSpaceInfo.src.transferFunction == nullptr) {
                    std::string source;
                    if (options.assignTF.has_value()) {
                        source = fmt::format("specified with --{}", options.kAssignTf);
                    } else {
                        source = fmt::format("used by input file \"{}\"", fmtInFile(inputFilepath));
                    }
                    auto errorMsg = fmt::format(errorFmt,
                                                "decode from",
                                                toString(colorSpaceInfo.src.usedTransferFunction),
                                                source);
                    if (!options.assignTF.has_value()) {
                        errorMsg += fmt::format(" Use an image processing tool to convert it or use"
                                                " --{}, with or without --{}, to specify handling.",
                                                options.kAssignTf, options.kConvertTf);
                    }
                    fatal(rc::NOT_SUPPORTED, errorMsg);
                }
                if (colorSpaceInfo.dst.transferFunction == nullptr) {
                    // If we get here it is because (a) a transfer supported for decode but not
                    // encode has been set with --assign-tf and (b) a primary conversion was
                    // requested with --convert-primaries. CLI checks prevent an unsupported
                    // transfer being given to --convert-tf.
                    auto source = fmt::format("specified with --{}", options.convertTF.has_value()
                                              ? options.kConvertTf : options.kAssignTf);
                    auto errorMsg = fmt::format(errorFmt,
                                                "encode to",
                                                toString(target.format().transfer()),
                                                source);
                    // Transfer functions derived from --format values are supported.
                    if (target.format().primaries() != colorSpaceInfo.src.usedPrimaries) {
                        errorMsg += fmt::format(" Decode and encode with transfer function is"
                                                " required to convert primaries to {}.",
                                                toString(target.format().primaries()));
                    }
                    fatal(rc::NOT_SUPPORTED, errorMsg);
                }
                if (!options.noWarnOnColorConversions) {
                    if (target.format().model() == KHR_DF_MODEL_RGBSDA
                        && target.format().transfer() == KHR_DF_TRANSFER_LINEAR) {
                        uint32_t bitLength;
                        try {
                            bitLength = target.format().channelBitLength();
                        } catch(...) {
                            // This happens if channels have different bit length. Check just R.
                            // If format is something like RGB565, any channel length would fail
                            // the bitLength test so picking R doesn't matter.
                            bitLength = target.format().channelBitLength(KHR_DF_CHANNEL_RGBSDA_R);
                        }

                        if (bitLength < 14) {
                            // Per Poynton, >= 14 bits is enough to handle all transitions
                            // visible to a human
                            if (colorSpaceInfo.src.usedTransferFunction == KHR_DF_TRANSFER_SRGB
                               || colorSpaceInfo.src.usedTransferFunction == KHR_DF_TRANSFER_ITU) {
                              warning("Input file \"{}\" is undergoing a visual lossy color conversion from {} "
                                      "to KHR_DF_TRANSFER_LINEAR. Specify an _SRGB format with --{} to prevent "
                                      "this warning.",
                                      fmtInFile(inputFilepath),
                                      toString(colorSpaceInfo.src.usedTransferFunction),
                                      options.kFormat);
                            }
                        }
                    }
                }
                if (target.format().primaries() != colorSpaceInfo.src.usedPrimaries) {
                //if (colorSpaceInfo.dst.colorPrimaries != nullptr) {
                    //assert(colorSpaceInfo.src.colorPrimaries != nullptr);
                    auto primaryTransform = colorSpaceInfo.src.colorPrimaries->transformTo(*colorSpaceInfo.dst.colorPrimaries);

                    if (options.failOnColorConversions)
                        fatal(rc::INVALID_FILE,
                            "Input file \"{}\" would need color conversion as input and output primaries are different. "
                            "Use --assign-primaries and do not use --convert-primaries to avoid unwanted color conversions.",
                            fmtInFile(inputFilepath));

                    if (options.warnOnColorConversions)
                        warning("Input file \"{}\" is color converted as input and output primaries are different. "
                            "Use --assign-primaries and do not use --convert-primaries to avoid unwanted color conversions.",
                            fmtInFile(inputFilepath));

                    // Transform transfer function with primary transform
                    image->transformColorSpace(*colorSpaceInfo.src.transferFunction, *colorSpaceInfo.dst.transferFunction, &primaryTransform);
                } else {
                    if (options.failOnColorConversions)
                        fatal(rc::INVALID_FILE,
                            "Input file \"{}\" would need color conversion as input and output transfer functions are different. "
                            "Use --assign-tf and do not use --convert-tf to avoid unwanted color conversions.",
                            fmtInFile(inputFilepath));

                    if (options.warnOnColorConversions)
                        warning("Input file \"{}\" is color converted as input and output transfer functions are different. "
                            "Use --assign-tf and do not use --convert-tf to avoid unwanted color conversions.",
                            fmtInFile(inputFilepath));

                    // Transform transfer function without primary transform
                    image->transformColorSpace(*colorSpaceInfo.src.transferFunction, *colorSpaceInfo.dst.transferFunction);
                }
            }

            // TODO: Add auto conversion and warning? Not needed now
            // because all supported source formats provide top-left images.

            if (image->getWidth() != targetImageWidth || image->getHeight() != targetImageHeight)
                image = scaleImage(std::move(image), targetImageWidth, targetImageHeight);

            if (target.origin() != usedSourceOrigin) {
                    if (options.failOnOriginChanges)
                        fatal(rc::INVALID_FILE,
                            "Input file \"{}\" would need to be y-flipped as input and output origins are different. "
                            "Use --{} and do not use --{} to avoid unwanted origin conversions.",
                            fmtInFile(inputFilepath), OptionsCreate::kAssignTexcoordOrigin,
                            OptionsCreate::kConvertTexcoordOrigin);

                    if (options.warnOnOriginChanges)
                        warning("Input file \"{}\" is y-flipped as input and output origins are different. "
                            "Use --{} and do not use --{} to avoid unwanted origin conversions.",
                            fmtInFile(inputFilepath), OptionsCreate::kAssignTexcoordOrigin,
                            OptionsCreate::kConvertTexcoordOrigin);

                // Only difference allowed by CLI is y down or y up.
                image->yflip();
            }

            if (options.normalize) {
                if (target.format().transfer() != KHR_DF_TRANSFER_UNSPECIFIED && target.format().transfer() != KHR_DF_TRANSFER_LINEAR) {
                    // Report source of problematic TF.
                    //
                    // If --format is an SRGB format
                    // - a fatal usage error will already have been thrown so nothing to do.
                    // If --format is non-SRGB format
                    // - absent TF options, an implicit conversion to LINEAR takes place if the file
                    //   TF is not LINEAR or UNSPECIFIED. If it can't be converted a fatal
                    //   unsupported conversion error will already have been thrown. Therefore
                    //   nothing to do. But if `create` is changed to set the TF for non-SRGB
                    //   formats from the file's TF then this error handling will need updating.
                    // - --assign-tf has many other possible values so that is a possible source.
                    // - --convert-tf can only be linear or srgb. If it's srgb and the format does
                    //   not have an equivalent SRGB format, that is another possible source.

                    //const auto input_error_message = "Input file \"{}\" The transfer function to be applied to the created texture is neither linear nor none. Normalize is only available for these transfer functions.";
                    //const auto inputTransfer =  inputImageFile->spec().format().transfer();
                    //bool is_file_error = (inputTransfer != KHR_DF_TRANSFER_UNSPECIFIED && inputTransfer != KHR_DF_TRANSFER_LINEAR);
                    const auto option_error_message = "--{} value is {}. Normalize can only be used if the transfer function is linear or none.";
                    if (options.convertTF.has_value()) {
                        fatal_usage(option_error_message, OptionsCreate::kConvertTf,
                                    toString(options.convertTF.value()));
                    } else if (options.assignTF.has_value()) {
                        fatal_usage(option_error_message, OptionsCreate::kAssignTf,
                                    toString(options.assignTF.value()));
                    }
                    assert(false && "target.format().transfer() is not suitable for --normalize though --assign-tf and --conver-tf were not used.");
                }
                image->normalize();
            }

            if (options.swizzleInput)
                image->swizzle(*options.swizzleInput);

            const auto imageData = convert(image, options.vkFormat, *inputImageFile);

            const auto ret = ktxTexture_SetImageFromMemory(
                    texture,
                    levelIndex,
                    layerIndex,
                    faceIndex + depthSliceIndex, // Faces and Depths are mutually exclusive, Addition is acceptable
                    imageData.data(),
                    imageData.size());
            assert(ret == KTX_SUCCESS && "Internal error"); (void) ret;

            if (options.mipmapGenerate) {
                uint32_t numMipLevels = options.levels.value_or(maxLevels);
                generateMipLevels(texture, std::move(image), *inputImageFile, numMipLevels, layerIndex, faceIndex, depthSliceIndex);
            }
        }
    });

    // Add KTXwriter metadata
    const auto writer = fmt::format("{} {}", commandName, version(options.testrun));
    ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
            static_cast<uint32_t>(writer.size() + 1), // +1 to include the \0
            writer.c_str());

    // Add KTXswizzle metadata
    if (options.swizzle) {
        ktxHashList_AddKVPair(&texture->kvDataHead, KTX_SWIZZLE_KEY,
                static_cast<uint32_t>(options.swizzle->size() + 1), // +1 to include the \0
                options.swizzle->c_str());
    }

    // Encode and apply compression

    MetricsCalculator metrics;
    metrics.saveReferenceImages(texture, options, *this);

    if (options.codec != BasisCodec::NONE)
        encodeBasis(texture, options);
    if (options.encodeASTC)
        encodeASTC(texture, options);

    metrics.decodeAndCalculateMetrics(texture, options, *this);

    compress(texture, options);

    // Add KTXwriterScParams metadata if ASTC encoding, BasisU encoding, or other supercompression was used
    const auto writerScParams = fmt::format("{}{}{}{}", options.astcOptions, options.codecOptions, options.commonOptions, options.compressOptions);
    if (writerScParams.size() > 0) {
        // Options always contain a leading space
        assert(writerScParams[0] == ' ');
        ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_SCPARAMS_KEY,
            static_cast<uint32_t>(writerScParams.size()),
            writerScParams.c_str() + 1); // +1 to exclude leading space
    }

    // Save output file
    const auto outputPath = std::filesystem::path(DecodeUTF8Path(options.outputFilepath));
    if (outputPath.has_parent_path())
        std::filesystem::create_directories(outputPath.parent_path());

    OutputStream outputFile(options.outputFilepath, *this);
    outputFile.writeKTX2(texture, *this);
}